

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall pstd::array<float,_3>::array(array<float,_3> *this,initializer_list<float> v)

{
  long lVar1;
  
  this->values[2] = 0.0;
  this->values[0] = 0.0;
  this->values[1] = 0.0;
  for (lVar1 = 0; v._M_len * 4 != lVar1; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->values + lVar1) = *(undefined4 *)((long)v._M_array + lVar1);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }